

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

bool __thiscall QAccessibleTree::selectRow(QAccessibleTree *this,int row)

{
  bool bVar1;
  byte bVar2;
  SelectionBehavior SVar3;
  SelectionMode SVar4;
  int iVar5;
  uint uVar6;
  QFlags<QItemSelectionModel::SelectionFlag> QVar7;
  QItemSelectionModel *pQVar8;
  int in_ESI;
  QAccessibleTree *in_RDI;
  long in_FS_OFFSET;
  QModelIndex index;
  QModelIndex *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  bool local_51;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QAccessibleTable::view((QAccessibleTable *)0x7f8074);
  pQVar8 = QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_ffffffffffffff60);
  if (pQVar8 == (QItemSelectionModel *)0x0) {
    local_51 = false;
    goto LAB_007f82a6;
  }
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  indexFromLogical(in_RDI,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
  bVar1 = QModelIndex::isValid(in_stack_ffffffffffffff60);
  if (bVar1) {
    QAccessibleTable::view((QAccessibleTable *)0x7f80ee);
    SVar3 = QAbstractItemView::selectionBehavior((QAbstractItemView *)in_stack_ffffffffffffff60);
    if (SVar3 != SelectColumns) {
      QAccessibleTable::view((QAccessibleTable *)0x7f810f);
      SVar4 = QAbstractItemView::selectionMode((QAbstractItemView *)in_stack_ffffffffffffff60);
      if (SVar4 == NoSelection) {
        local_51 = false;
        goto LAB_007f82a6;
      }
      if (SVar4 == SingleSelection) {
        QAccessibleTable::view((QAccessibleTable *)0x7f8150);
        SVar3 = QAbstractItemView::selectionBehavior((QAbstractItemView *)in_stack_ffffffffffffff60)
        ;
        if ((SVar3 != SelectRows) &&
           (iVar5 = (**(code **)(*(long *)&in_RDI->super_QAccessibleTable + 0x58))(), 1 < iVar5)) {
          local_51 = false;
          goto LAB_007f82a6;
        }
        QAccessibleTable::view((QAccessibleTable *)0x7f8181);
        QAbstractItemView::clearSelection((QAbstractItemView *)in_stack_ffffffffffffff60);
      }
      else if (SVar4 == ContiguousSelection) {
        if (in_ESI == 0) {
LAB_007f81ee:
          QAccessibleTable::view((QAccessibleTable *)0x7f81f8);
          pQVar8 = QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_ffffffffffffff60)
          ;
          QAccessibleTable::view((QAccessibleTable *)0x7f821a);
          QAbstractItemView::rootIndex((QAbstractItemView *)in_stack_ffffffffffffff60);
          bVar2 = QItemSelectionModel::isRowSelected((int)pQVar8,(QModelIndex *)(ulong)(in_ESI + 1))
          ;
          bVar2 = bVar2 ^ 0xff;
        }
        else {
          QAccessibleTable::view((QAccessibleTable *)0x7f819f);
          pQVar8 = QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_ffffffffffffff60)
          ;
          QAccessibleTable::view((QAccessibleTable *)0x7f81c1);
          QAbstractItemView::rootIndex((QAbstractItemView *)in_stack_ffffffffffffff60);
          uVar6 = QItemSelectionModel::isRowSelected((int)pQVar8,(QModelIndex *)(ulong)(in_ESI - 1))
          ;
          bVar2 = 0;
          if ((uVar6 & 1) == 0) goto LAB_007f81ee;
        }
        if ((bVar2 & 1) != 0) {
          QAccessibleTable::view((QAccessibleTable *)0x7f8254);
          QAbstractItemView::clearSelection((QAbstractItemView *)in_stack_ffffffffffffff60);
        }
      }
      QAccessibleTable::view((QAccessibleTable *)0x7f826a);
      pQVar8 = QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_ffffffffffffff60);
      QVar7 = ::operator|((enum_type)((ulong)pQVar8 >> 0x20),(enum_type)pQVar8);
      (**(code **)(*(long *)pQVar8 + 0x68))
                (pQVar8,&local_20,
                 QVar7.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
                 super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
      local_51 = true;
      goto LAB_007f82a6;
    }
  }
  local_51 = false;
LAB_007f82a6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_51;
}

Assistant:

bool QAccessibleTree::selectRow(int row)
{
    if (!view()->selectionModel())
        return false;
    QModelIndex index = indexFromLogical(row);

    if (!index.isValid() || view()->selectionBehavior() == QAbstractItemView::SelectColumns)
        return false;

    switch (view()->selectionMode()) {
    case QAbstractItemView::NoSelection:
        return false;
    case QAbstractItemView::SingleSelection:
        if ((view()->selectionBehavior() != QAbstractItemView::SelectRows) && (columnCount() > 1))
            return false;
        view()->clearSelection();
        break;
    case QAbstractItemView::ContiguousSelection:
        if ((!row || !view()->selectionModel()->isRowSelected(row - 1, view()->rootIndex()))
            && !view()->selectionModel()->isRowSelected(row + 1, view()->rootIndex()))
            view()->clearSelection();
        break;
    default:
        break;
    }

    view()->selectionModel()->select(index, QItemSelectionModel::Select | QItemSelectionModel::Rows);
    return true;
}